

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O2

void __thiscall
Assimp::LWOImporter::CopyFaceIndicesLWO2
          (LWOImporter *this,iterator *it,uint16_t **cursor,uint16_t *end)

{
  ushort uVar1;
  Face *pFVar2;
  ushort *puVar3;
  ushort uVar4;
  int iVar5;
  uint *puVar6;
  Logger *this_00;
  DeadlyImportError *this_01;
  uint i;
  ulong uVar7;
  allocator<char> local_61;
  iterator *local_60;
  uint16_t *local_58;
  string local_50;
  
  local_60 = it;
  local_58 = end;
  while( true ) {
    if (local_58 <= *cursor) {
      return;
    }
    pFVar2 = local_60->_M_current;
    local_60->_M_current = pFVar2 + 1;
    puVar3 = *cursor;
    *cursor = puVar3 + 1;
    uVar1 = *puVar3;
    uVar4 = (uVar1 & 0xff03) << 8 | uVar1 >> 8;
    (pFVar2->super_aiFace).mNumIndices = (uint)uVar4;
    if ((uVar1 & 0xff03) == 0) break;
    puVar6 = (uint *)operator_new__((ulong)uVar4 << 2);
    (pFVar2->super_aiFace).mIndices = puVar6;
    for (uVar7 = 0; uVar7 < (pFVar2->super_aiFace).mNumIndices; uVar7 = uVar7 + 1) {
      iVar5 = ReadVSizedIntLWO2(this,(uint8_t **)cursor);
      (pFVar2->super_aiFace).mIndices[uVar7] = iVar5 + this->mCurLayer->mPointIDXOfs;
      if ((ulong)(((long)(this->mCurLayer->mTempPoints).
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->mCurLayer->mTempPoints).
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0xc) <
          (ulong)(pFVar2->super_aiFace).mIndices[uVar7]) {
        this_00 = DefaultLogger::get();
        Logger::warn(this_00,"LWO2: Failure evaluating face record, index is out of range");
        (pFVar2->super_aiFace).mIndices[uVar7] =
             (int)(((long)(this->mCurLayer->mTempPoints).
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->mCurLayer->mTempPoints).
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start) / 0xc) - 1;
      }
    }
  }
  this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"LWO2: Encountered invalid face record with zero indices",&local_61
            );
  DeadlyImportError::DeadlyImportError(this_01,&local_50);
  __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void LWOImporter::CopyFaceIndicesLWO2(FaceList::iterator& it,
    uint16_t*& cursor,
    const uint16_t* const end)
{
    while (cursor < end)
    {
        LWO::Face& face = *it++;
        uint16_t numIndices;
        ::memcpy(&numIndices, cursor++, 2);
        AI_LSWAP2(numIndices);
        face.mNumIndices = numIndices & 0x03FF;

        if(face.mNumIndices) /* byte swapping has already been done */
        {
            face.mIndices = new unsigned int[face.mNumIndices];
            for(unsigned int i = 0; i < face.mNumIndices; i++)
            {
                face.mIndices[i] = ReadVSizedIntLWO2((uint8_t*&)cursor) + mCurLayer->mPointIDXOfs;
                if(face.mIndices[i] > mCurLayer->mTempPoints.size())
                {
                    ASSIMP_LOG_WARN("LWO2: Failure evaluating face record, index is out of range");
                    face.mIndices[i] = (unsigned int)mCurLayer->mTempPoints.size()-1;
                }
            }
        }
        else throw DeadlyImportError("LWO2: Encountered invalid face record with zero indices");
    }
}